

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_material.cpp
# Opt level: O2

uchar * __thiscall
FGLTexture::CreateTexBuffer
          (FGLTexture *this,int translation,int *w,int *h,FTexture *hirescheck,bool createexpanded,
          bool alphatrans)

{
  ushort uVar1;
  FTexture *this_00;
  byte bVar2;
  bool bVar3;
  int trans;
  int iVar4;
  uchar *puVar5;
  ulong uVar6;
  int h_00;
  int w_00;
  ulong __n;
  FBitmap imgCreate;
  uchar *local_d0;
  FGLBitmap local_a0;
  int *local_68;
  FBitmap local_60;
  
  if (((hirescheck != (FTexture *)0x0 && !alphatrans) && gl_texture_usehires.Value) &&
     (puVar5 = LoadHiresTexture(this,hirescheck,w,h), puVar5 != (uchar *)0x0)) {
    return puVar5;
  }
  bVar2 = this->bExpandFlag & createexpanded;
  uVar6 = (ulong)bVar2;
  this_00 = this->tex;
  w_00 = (uint)this_00->Width + (uint)bVar2 * 2;
  *w = w_00;
  uVar1 = this_00->Height;
  h_00 = (uint)uVar1 + (uint)bVar2 * 2;
  *h = h_00;
  iVar4 = w_00 * 4;
  __n = (ulong)(((uint)uVar1 + (uint)bVar2 * 2 + 1) * iVar4);
  local_68 = w;
  local_d0 = (uchar *)operator_new__(__n);
  memset(local_d0,0,__n);
  local_a0.super_FBitmap.FreeBuffer = false;
  local_a0.super_FBitmap.ClipRect.x = 0;
  local_a0.super_FBitmap.ClipRect.y = 0;
  local_a0.super_FBitmap._vptr_FBitmap = (_func_int **)&PTR__FBitmap_007c4020;
  local_a0.translation = 0;
  if (translation != -0x539) {
    local_a0.translation = translation;
  }
  local_a0.alphatrans = alphatrans;
  local_a0.super_FBitmap.data = local_d0;
  local_a0.super_FBitmap.Width = w_00;
  local_a0.super_FBitmap.Height = h_00;
  local_a0.super_FBitmap.Pitch = iVar4;
  local_a0.super_FBitmap.ClipRect.width = w_00;
  local_a0.super_FBitmap.ClipRect.height = h_00;
  if ((this_00->field_0x32 & 1) == 0) {
    if (translation < 1) {
      iVar4 = (*this_00->_vptr_FTexture[4])(this_00,&local_a0,uVar6,uVar6,0,0);
      FTexture::CheckTrans(this->tex,local_d0,h_00 * w_00,iVar4);
      this->bIsTransparent = (char)((this->tex->gl_info).field_0x4c << 6) >> 6;
    }
    else {
      FTexture::CopyTrueColorPixels
                (this_00,&local_a0.super_FBitmap,(uint)bVar2,(uint)bVar2,0,(FCopyInfo *)0x0);
      this->bIsTransparent = '\0';
    }
  }
  else {
    local_60._vptr_FBitmap = (_func_int **)&PTR__FBitmap_007e65b0;
    local_60.data = (BYTE *)0x0;
    local_60._16_5_ = 0;
    local_60.Height._1_3_ = 0;
    local_60.Pitch = 0;
    local_60.FreeBuffer = false;
    local_60.ClipRect.x = 0;
    local_60.ClipRect.y = 0;
    local_60.ClipRect.width = 0;
    local_60.ClipRect.height = 0;
    bVar3 = FBitmap::Create(&local_60,w_00,h_00);
    if (bVar3) {
      memset(local_60.data,0,(ulong)(uint)(h_00 * w_00 * 4));
      trans = (*this->tex->_vptr_FTexture[4])(this->tex,&local_60,uVar6,uVar6,0,0);
      FGLBitmap::CopyPixelDataRGB
                (&local_a0,0,0,local_60.data,w_00,h_00,4,iVar4,0,6,(FCopyInfo *)0x0,0,0,0);
      FTexture::CheckTrans(this->tex,local_d0,h_00 * w_00,trans);
      this->bIsTransparent = (char)((this->tex->gl_info).field_0x4c << 6) >> 6;
    }
    FBitmap::~FBitmap(&local_60);
  }
  if (createexpanded) {
    local_d0 = gl_CreateUpsampledTextureBuffer
                         (this->tex,local_d0,w_00,h_00,local_68,h,this->bIsTransparent != '\0');
  }
  FBitmap::~FBitmap(&local_a0.super_FBitmap);
  return local_d0;
}

Assistant:

unsigned char * FGLTexture::CreateTexBuffer(int translation, int & w, int & h, FTexture *hirescheck, bool createexpanded, bool alphatrans)
{
	unsigned char * buffer;
	int W, H;


	// Textures that are already scaled in the texture lump will not get replaced
	// by hires textures
	if (gl_texture_usehires && hirescheck != NULL && !alphatrans)
	{
		buffer = LoadHiresTexture (hirescheck, &w, &h);
		if (buffer)
		{
			return buffer;
		}
	}

	int exx = bExpandFlag && createexpanded;

	W = w = tex->GetWidth() + 2 * exx;
	H = h = tex->GetHeight() + 2 * exx;


	buffer=new unsigned char[W*(H+1)*4];
	memset(buffer, 0, W * (H+1) * 4);

	FGLBitmap bmp(buffer, W*4, W, H);
	bmp.SetTranslationInfo(translation, alphatrans);

	if (tex->bComplex)
	{
		FBitmap imgCreate;

		// The texture contains special processing so it must be composited using the
		// base bitmap class and then be converted as a whole.
		if (imgCreate.Create(W, H))
		{
			memset(imgCreate.GetPixels(), 0, W * H * 4);
			int trans = tex->CopyTrueColorPixels(&imgCreate, exx, exx);
			bmp.CopyPixelDataRGB(0, 0, imgCreate.GetPixels(), W, H, 4, W * 4, 0, CF_BGRA);
			tex->CheckTrans(buffer, W*H, trans);
			bIsTransparent = tex->gl_info.mIsTransparent;
		}
	}
	else if (translation<=0)
	{
		int trans = tex->CopyTrueColorPixels(&bmp, exx, exx);
		tex->CheckTrans(buffer, W*H, trans);
		bIsTransparent = tex->gl_info.mIsTransparent;
	}
	else
	{
		// When using translations everything must be mapped to the base palette.
		// Since FTexture's method is doing exactly that by calling GetPixels let's use that here
		// to do all the dirty work for us. ;)
		tex->FTexture::CopyTrueColorPixels(&bmp, exx, exx);
		bIsTransparent = 0;
	}

	// if we just want the texture for some checks there's no need for upsampling.
	if (!createexpanded) return buffer;

	// [BB] The hqnx upsampling (not the scaleN one) destroys partial transparency, don't upsamle textures using it.
	// [BB] Potentially upsample the buffer.
	return gl_CreateUpsampledTextureBuffer ( tex, buffer, W, H, w, h, !!bIsTransparent);
}